

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O3

void png_set_cHRM_XYZ(png_const_structrp png_ptr,png_inforp info_ptr,double red_X,double red_Y,
                     double red_Z,double green_X,double green_Y,double green_Z,double blue_X,
                     double blue_Y,double blue_Z)

{
  png_fixed_point int_red_X;
  png_fixed_point int_red_Y;
  png_fixed_point int_red_Z;
  png_fixed_point int_green_X;
  png_fixed_point int_green_Y;
  png_fixed_point int_green_Z;
  png_fixed_point int_blue_X;
  png_fixed_point int_blue_Y;
  png_fixed_point int_blue_Z;
  
  int_red_X = png_fixed(png_ptr,red_X,"cHRM Red X");
  int_red_Y = png_fixed(png_ptr,red_Y,"cHRM Red Y");
  int_red_Z = png_fixed(png_ptr,red_Z,"cHRM Red Z");
  int_green_X = png_fixed(png_ptr,green_X,"cHRM Green X");
  int_green_Y = png_fixed(png_ptr,green_Y,"cHRM Green Y");
  int_green_Z = png_fixed(png_ptr,green_Z,"cHRM Green Z");
  int_blue_X = png_fixed(png_ptr,blue_X,"cHRM Blue X");
  int_blue_Y = png_fixed(png_ptr,blue_Y,"cHRM Blue Y");
  int_blue_Z = png_fixed(png_ptr,blue_Z,"cHRM Blue Z");
  png_set_cHRM_XYZ_fixed
            (png_ptr,info_ptr,int_red_X,int_red_Y,int_red_Z,int_green_X,int_green_Y,int_green_Z,
             int_blue_X,int_blue_Y,int_blue_Z);
  return;
}

Assistant:

void PNGAPI
png_set_cHRM_XYZ(png_const_structrp png_ptr, png_inforp info_ptr, double red_X,
    double red_Y, double red_Z, double green_X, double green_Y, double green_Z,
    double blue_X, double blue_Y, double blue_Z)
{
   png_set_cHRM_XYZ_fixed(png_ptr, info_ptr,
       png_fixed(png_ptr, red_X, "cHRM Red X"),
       png_fixed(png_ptr, red_Y, "cHRM Red Y"),
       png_fixed(png_ptr, red_Z, "cHRM Red Z"),
       png_fixed(png_ptr, green_X, "cHRM Green X"),
       png_fixed(png_ptr, green_Y, "cHRM Green Y"),
       png_fixed(png_ptr, green_Z, "cHRM Green Z"),
       png_fixed(png_ptr, blue_X, "cHRM Blue X"),
       png_fixed(png_ptr, blue_Y, "cHRM Blue Y"),
       png_fixed(png_ptr, blue_Z, "cHRM Blue Z"));
}